

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconvert_linux.c
# Opt level: O2

void CharConvSW(charconv *CC,char *Out,size_t OutLen,wchar_t *In)

{
  size_t sVar1;
  long lVar2;
  wchar_t wVar3;
  char *_Out;
  size_t _OutLen;
  size_t _InLen;
  char *_In;
  
  if (OutLen != 0) {
    _In = (char *)In;
    sVar1 = wcslen(In);
    _InLen = sVar1 + 1;
    _Out = Out;
    _OutLen = OutLen;
    if (((_InLen == 0 || CC == (charconv *)0x0) ||
        (sVar1 = iconv(CC,&_In,&_InLen,&_Out,&_OutLen), sVar1 == 0xffffffffffffffff)) ||
       (sVar1 = iconv(CC,(char **)0x0,(size_t *)0x0,&_Out,&_OutLen), sVar1 == 0xffffffffffffffff)) {
      for (lVar2 = 0; (1 < OutLen && (wVar3 = In[lVar2], wVar3 != L'\0')); lVar2 = lVar2 + 1) {
        if (L'ÿ' < wVar3) {
          wVar3 = L'*';
        }
        Out[lVar2] = (char)wVar3;
        OutLen = OutLen - 1;
      }
      Out[lVar2] = '\0';
      if ((CC != (charconv *)0x0) && (_InLen != 0)) {
        iconv(CC,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
      }
    }
    else {
      *_Out = '\0';
    }
  }
  return;
}

Assistant:

void CharConvSW(charconv* CC, char* Out, size_t OutLen, const wchar_t* In)
{
    if (OutLen>0)
    {
        ICONV_CONST char* _In = (ICONV_CONST char*)In;
        size_t _InLen = wcslen(In)+1;
        char* _Out = Out;
        size_t _OutLen = OutLen;

        if (!CC || !_InLen || iconv((iconv_t)CC, &_In, &_InLen, &_Out, &_OutLen) == (size_t)-1 ||
                    iconv((iconv_t)CC, NULL, NULL, &_Out, &_OutLen) == (size_t)-1)
        {
            for (;OutLen>1 && *In;++In,--OutLen,++Out)
                *Out = (char)(*In>255?'*':*In);
            *Out = 0;
            if (CC && _InLen) iconv((iconv_t)CC, NULL, NULL, NULL, NULL); // reset state
        }
        else
            *_Out=0;
    }
}